

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  undefined2 in_CX;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)5,_(moira::Size)2> dst;
  Imu src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined6 in_stack_ffffffffffffffc8;
  u16 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  Imu in_stack_ffffffffffffffd4;
  Ea<(moira::Mode)5,_(moira::Size)2> *in_stack_ffffffffffffffd8;
  Imu in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  v = dasmRead<(moira::Size)2>
                ((Moira *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  Imu::Imu((Imu *)&stack0xffffffffffffffe0,v);
  Op<(moira::Mode)5,(moira::Size)2>
            ((Moira *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)in_RDI[5]);
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffd4);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)
             CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0.raw)),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}